

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  int local_40;
  int time_step;
  int tfnd;
  int opt;
  int otp_length;
  char otp [13];
  time_t now;
  char **argv_local;
  int argc_local;
  
  otp[5] = '\0';
  otp[6] = '\0';
  otp[7] = '\0';
  otp[8] = '\0';
  otp[9] = '\0';
  otp[10] = '\0';
  otp[0xb] = '\0';
  otp[0xc] = '\0';
  tfnd = 8;
  bVar1 = false;
  local_40 = 0x1e;
  while (iVar2 = getopt(argc,argv,"hl:t:T:"), iVar2 != -1) {
    switch(iVar2) {
    case 0x54:
      local_40 = atoi(_optarg);
      break;
    default:
      print_usage((FILE *)_stderr,*argv);
      return 1;
    case 0x68:
      print_usage(_stdout,*argv);
      return 0;
    case 0x6c:
      tfnd = atoi(_optarg);
      if (0xc < tfnd) {
        fprintf(_stderr,"Password length %d exceeds maximum of %d",(ulong)(uint)tfnd,0xc);
        return 1;
      }
      break;
    case 0x74:
      otp._5_8_ = atol(_optarg);
      bVar1 = true;
    }
  }
  if (_optind + 1 != argc) {
    print_usage((FILE *)_stderr,*argv);
    return 1;
  }
  if ((!bVar1) && (tVar3 = time((time_t *)(otp + 5)), tVar3 == -1)) {
    perror("time");
    return -1;
  }
  mtotp_totp(argv[_optind],otp._5_8_,local_40,tfnd,(long)&opt + 3);
  printf("%s\n",(long)&opt + 3);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  time_t now = 0;
  char otp[OTP_MAX_LENGTH + 1];
  int otp_length = OTP_DEFAULT_LENGTH;
  int opt;
  int tfnd = 0;
  int time_step = TIME_STEP_DEFAULT;

  while ((opt = getopt(argc, argv, "hl:t:T:")) != -1) {
    switch (opt) {
    case 'h':
      print_usage(stdout, argv[0]);
      return 0;
    case 'l':
      otp_length = atoi(optarg);
      if (otp_length > OTP_MAX_LENGTH) {
        fprintf(stderr, "Password length %d exceeds maximum of %d", otp_length,
                OTP_MAX_LENGTH);
        return 1;
      }
      break;
    case 't':
      now = atol(optarg);
      tfnd = 1;
      break;
    case 'T':
      time_step = atoi(optarg);
      break;
    default:
      print_usage(stderr, argv[0]);
      return 1;
    }
  }

  if (optind + 1 != argc) {
    print_usage(stderr, argv[0]);
    return 1;
  }

  if (!tfnd && time(&now) == -1) {
    perror("time");
    return -1;
  }

  mtotp_totp(argv[optind], now, time_step, otp_length, otp);
  printf("%s\n", otp);
  return 0;
}